

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall sensors_analytics::DefaultConsumer::~DefaultConsumer(DefaultConsumer *this)

{
  DefaultConsumer *this_local;
  
  Close(this);
  std::__cxx11::string::~string((string *)&this->data_file_path_);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->records_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

DefaultConsumer::~DefaultConsumer() {
  Close();
}